

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O3

unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> __thiscall
acto::core::object_t::select_message(object_t *this)

{
  msg_t *pmVar1;
  msg_t *pmVar2;
  msg_t *pmVar3;
  msg_t *pmVar4;
  __uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true> in_RDI;
  bool bVar5;
  
  pmVar3 = (this->local_stack).head_;
  if (pmVar3 == (msg_t *)0x0) {
    do {
      pmVar1 = (this->input_stack).head_._M_b._M_p;
      if (pmVar1 == (msg_t *)0x0) {
        pmVar3 = (this->local_stack).head_;
        if (pmVar3 != (msg_t *)0x0) goto LAB_00105a57;
        pmVar3 = (msg_t *)0x0;
        goto LAB_00105a67;
      }
      LOCK();
      bVar5 = pmVar1 == (this->input_stack).head_._M_b._M_p;
      if (bVar5) {
        (this->input_stack).head_._M_b._M_p = (__pointer_type)0x0;
      }
      UNLOCK();
    } while (!bVar5);
    pmVar2 = (this->local_stack).head_;
    do {
      pmVar3 = pmVar1;
      pmVar4 = pmVar2;
      pmVar1 = (pmVar3->super_node<acto::core::msg_t>).next;
      (pmVar3->super_node<acto::core::msg_t>).next = pmVar4;
      pmVar2 = pmVar3;
    } while (pmVar1 != (msg_t *)0x0);
  }
  else {
LAB_00105a57:
    pmVar4 = (pmVar3->super_node<acto::core::msg_t>).next;
  }
  (this->local_stack).head_ = pmVar4;
  (pmVar3->super_node<acto::core::msg_t>).next = (msg_t *)0x0;
LAB_00105a67:
  *(msg_t **)
   in_RDI.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
   super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
   super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = pmVar3;
  return (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         (tuple<acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>)
         in_RDI.super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>.
         _M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
         super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
}

Assistant:

constexpr T* pop() noexcept {
    T* result = head_;

    if (result) {
      head_ = result->next;
      result->next = nullptr;
    }
    return result;
  }